

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

SmartPointer<GEO::Counted> * __thiscall
GEO::SmartPointer<GEO::Counted>::operator=(SmartPointer<GEO::Counted> *this,Counted *ptr)

{
  if (this->pointer_ != ptr) {
    Counted::unref(this->pointer_);
    this->pointer_ = ptr;
    if (ptr != (Counted *)0x0) {
      ptr->nb_refs_ = ptr->nb_refs_ + 1;
    }
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }